

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrCex.c
# Opt level: O0

Abc_Cex_t *
Aig_ManVerifyUsingBddsCountExample
          (Aig_Man_t *p,DdManager *dd,DdNode **pbParts,Vec_Ptr_t *vOnionRings,DdNode *bCubeFirst,
          int iOutput,int fVerbose,int fSilent)

{
  Vec_Ptr_t *pVVar1;
  DdNode **ppDVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  abctime aVar7;
  Abc_Cex_t *p_00;
  DdNode *pDVar8;
  Bbr_ImageTree_t *pTree_00;
  char *string;
  DdNode *n;
  abctime aVar9;
  abctime clk;
  char *pValues;
  int nPiOffset;
  int RetValue;
  int v;
  int i;
  DdNode *bRing;
  DdNode *bVar;
  DdNode *bTemp;
  DdNode *bImage;
  DdNode *bState;
  DdNode *bCubeNs;
  Bbr_ImageTree_t *pTree;
  Aig_Obj_t *pObj;
  Abc_Cex_t *pCex;
  int iOutput_local;
  DdNode *bCubeFirst_local;
  Vec_Ptr_t *vOnionRings_local;
  DdNode **pbParts_local;
  DdManager *dd_local;
  Aig_Man_t *p_local;
  
  aVar7 = Abc_Clock();
  iVar3 = Saig_ManRegNum(p);
  iVar4 = Saig_ManPiNum(p);
  iVar5 = Vec_PtrSize(vOnionRings);
  p_00 = Abc_CexAlloc(iVar3,iVar4,iVar5 + 1);
  iVar3 = Vec_PtrSize(vOnionRings);
  p_00->iFrame = iVar3;
  p_00->iPo = iOutput;
  iVar5 = Saig_ManRegNum(p);
  iVar3 = Saig_ManPiNum(p);
  iVar4 = Vec_PtrSize(vOnionRings);
  iVar5 = iVar5 + iVar3 * iVar4;
  iVar3 = Saig_ManCiNum(p);
  iVar4 = Saig_ManCiNum(p);
  iVar6 = Saig_ManRegNum(p);
  pDVar8 = Bbr_bddComputeRangeCube(dd,iVar3,iVar4 + iVar6);
  Cudd_Ref(pDVar8);
  iVar3 = Saig_ManRegNum(p);
  iVar4 = Saig_ManCiNum(p);
  pTree_00 = Bbr_bddImageStart(dd,pDVar8,iVar3,pbParts,iVar4,dd->vars,100000000,fVerbose);
  Cudd_RecursiveDeref(dd,pDVar8);
  if (pTree_00 == (Bbr_ImageTree_t *)0x0) {
    if (fSilent == 0) {
      printf("BDDs blew up during qualitification scheduling.  ");
    }
    return (Abc_Cex_t *)0x0;
  }
  string = (char *)malloc((long)dd->size);
  iVar3 = Cudd_bddPickOneCube(dd,bCubeFirst,string);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrCex.c"
                  ,0x53,
                  "Abc_Cex_t *Aig_ManVerifyUsingBddsCountExample(Aig_Man_t *, DdManager *, DdNode **, Vec_Ptr_t *, DdNode *, int, int, int)"
                 );
  }
  for (RetValue = 0; iVar3 = Saig_ManPiNum(p), RetValue < iVar3; RetValue = RetValue + 1) {
    Vec_PtrEntry(p->vCis,RetValue);
    if (string[RetValue] == '\x01') {
      Abc_InfoSetBit((uint *)(p_00 + 1),iVar5 + RetValue);
    }
  }
  iVar3 = Saig_ManPiNum(p);
  pValues._0_4_ = iVar5 - iVar3;
  bImage = dd->one;
  Cudd_Ref(bImage);
  for (RetValue = 0; iVar3 = Saig_ManRegNum(p), RetValue < iVar3; RetValue = RetValue + 1) {
    pVVar1 = p->vCis;
    iVar3 = Saig_ManPiNum(p);
    Vec_PtrEntry(pVVar1,RetValue + iVar3);
    ppDVar2 = dd->vars;
    iVar3 = Saig_ManCiNum(p);
    pDVar8 = ppDVar2[iVar3 + RetValue];
    iVar3 = Saig_ManPiNum(p);
    pDVar8 = Cudd_bddAnd(dd,bImage,
                         (DdNode *)
                         ((ulong)pDVar8 ^ (long)(int)(uint)(string[iVar3 + RetValue] != '\x01')));
    Cudd_Ref(pDVar8);
    Cudd_RecursiveDeref(dd,bImage);
    bImage = pDVar8;
  }
  nPiOffset = Vec_PtrSize(vOnionRings);
  while( true ) {
    nPiOffset = nPiOffset + -1;
    if (nPiOffset < 0) goto LAB_00a7632c;
    pDVar8 = (DdNode *)Vec_PtrEntry(vOnionRings,nPiOffset);
    n = Bbr_bddImageCompute(pTree_00,bImage);
    if (n == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,bImage);
      if (fSilent == 0) {
        printf("BDDs blew up during image computation.  ");
      }
      Bbr_bddImageTreeDelete(pTree_00);
      if (string != (char *)0x0) {
        free(string);
      }
      return (Abc_Cex_t *)0x0;
    }
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,bImage);
    pDVar8 = Cudd_bddAnd(dd,n,pDVar8);
    Cudd_Ref(pDVar8);
    Cudd_RecursiveDeref(dd,n);
    iVar3 = Cudd_bddPickOneCube(dd,pDVar8,string);
    if (iVar3 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrCex.c"
                    ,0x7b,
                    "Abc_Cex_t *Aig_ManVerifyUsingBddsCountExample(Aig_Man_t *, DdManager *, DdNode **, Vec_Ptr_t *, DdNode *, int, int, int)"
                   );
    }
    Cudd_RecursiveDeref(dd,pDVar8);
    for (RetValue = 0; iVar3 = Saig_ManPiNum(p), RetValue < iVar3; RetValue = RetValue + 1) {
      Vec_PtrEntry(p->vCis,RetValue);
      if (string[RetValue] == '\x01') {
        Abc_InfoSetBit((uint *)(p_00 + 1),(int)pValues + RetValue);
      }
    }
    iVar3 = Saig_ManPiNum(p);
    pValues._0_4_ = (int)pValues - iVar3;
    if (nPiOffset == 0) break;
    bImage = dd->one;
    Cudd_Ref(bImage);
    for (RetValue = 0; iVar3 = Saig_ManRegNum(p), RetValue < iVar3; RetValue = RetValue + 1) {
      pVVar1 = p->vCis;
      iVar3 = Saig_ManPiNum(p);
      Vec_PtrEntry(pVVar1,RetValue + iVar3);
      ppDVar2 = dd->vars;
      iVar3 = Saig_ManCiNum(p);
      pDVar8 = ppDVar2[iVar3 + RetValue];
      iVar3 = Saig_ManPiNum(p);
      pDVar8 = Cudd_bddAnd(dd,bImage,
                           (DdNode *)
                           ((ulong)pDVar8 ^ (long)(int)(uint)(string[iVar3 + RetValue] != '\x01')));
      Cudd_Ref(pDVar8);
      Cudd_RecursiveDeref(dd,bImage);
      bImage = pDVar8;
    }
  }
  for (RetValue = 0; iVar3 = Saig_ManRegNum(p), RetValue < iVar3; RetValue = RetValue + 1) {
    pVVar1 = p->vCis;
    iVar3 = Saig_ManPiNum(p);
    Vec_PtrEntry(pVVar1,RetValue + iVar3);
    iVar3 = Saig_ManPiNum(p);
    if (string[iVar3 + RetValue] != '\0') {
      __assert_fail("pValues[Saig_ManPiNum(p)+i] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrCex.c"
                    ,0x88,
                    "Abc_Cex_t *Aig_ManVerifyUsingBddsCountExample(Aig_Man_t *, DdManager *, DdNode **, Vec_Ptr_t *, DdNode *, int, int, int)"
                   );
    }
  }
LAB_00a7632c:
  Bbr_bddImageTreeDelete(pTree_00);
  if (string != (char *)0x0) {
    free(string);
  }
  iVar3 = Vec_PtrSize(vOnionRings);
  if (((iVar3 < 1000) && (iVar3 = Saig_ManVerifyCex(p,p_00), iVar3 == 0)) && (fSilent == 0)) {
    printf("Aig_ManVerifyUsingBdds(): Counter-example verification has FAILED.\n");
  }
  if (fVerbose == 0) {
    return p_00;
  }
  if (fSilent != 0) {
    return p_00;
  }
  Abc_Print(1,"%s =","Counter-example generation time");
  aVar9 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar9 - aVar7) * 1.0) / 1000000.0);
  return p_00;
}

Assistant:

Abc_Cex_t * Aig_ManVerifyUsingBddsCountExample( Aig_Man_t * p, DdManager * dd, 
    DdNode ** pbParts, Vec_Ptr_t * vOnionRings, DdNode * bCubeFirst,
    int iOutput, int fVerbose, int fSilent )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    Bbr_ImageTree_t * pTree;
    DdNode * bCubeNs, * bState, * bImage;
    DdNode * bTemp, * bVar, * bRing;
    int i, v, RetValue, nPiOffset;
    char * pValues;
    abctime clk = Abc_Clock();
//printf( "\nDeriving counter-example.\n" );

    // allocate room for the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(p), Saig_ManPiNum(p), Vec_PtrSize(vOnionRings)+1 );
    pCex->iFrame = Vec_PtrSize(vOnionRings);
    pCex->iPo = iOutput;
    nPiOffset = Saig_ManRegNum(p) + Saig_ManPiNum(p) * Vec_PtrSize(vOnionRings);

    // create the cube of NS variables
    bCubeNs  = Bbr_bddComputeRangeCube( dd, Saig_ManCiNum(p), Saig_ManCiNum(p)+Saig_ManRegNum(p) );    Cudd_Ref( bCubeNs );
    pTree = Bbr_bddImageStart( dd, bCubeNs, Saig_ManRegNum(p), pbParts, Saig_ManCiNum(p), dd->vars, 100000000, fVerbose );
    Cudd_RecursiveDeref( dd, bCubeNs );
    if ( pTree == NULL )
    {
        if ( !fSilent )
            printf( "BDDs blew up during qualitification scheduling.  " );
        return NULL;
    }

    // allocate room for the cube
    pValues = ABC_ALLOC( char, dd->size );

    // get the last cube
    RetValue = Cudd_bddPickOneCube( dd, bCubeFirst, pValues );
    assert( RetValue );

    // write PIs of counter-example
    Saig_ManForEachPi( p, pObj, i )
        if ( pValues[i] == 1 )
            Abc_InfoSetBit( pCex->pData, nPiOffset + i );
    nPiOffset -= Saig_ManPiNum(p);

    // write state in terms of NS variables
    bState = (dd)->one; Cudd_Ref( bState );
    Saig_ManForEachLo( p, pObj, i )
    {
        bVar = Cudd_NotCond( dd->vars[Saig_ManCiNum(p)+i], pValues[Saig_ManPiNum(p)+i] != 1 );
        bState = Cudd_bddAnd( dd, bTemp = bState, bVar );  Cudd_Ref( bState );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }

    // perform backward analysis
    Vec_PtrForEachEntryReverse( DdNode *, vOnionRings, bRing, v )
    { 
        // compute the next states
        bImage = Bbr_bddImageCompute( pTree, bState );           
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( dd, bState );
            if ( !fSilent )
                printf( "BDDs blew up during image computation.  " );
            Bbr_bddImageTreeDelete( pTree );
            ABC_FREE( pValues );
            return NULL;
        }
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bState );

        // intersect with the previous set
        bImage = Cudd_bddAnd( dd, bTemp = bImage, bRing );  Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );

        // find any assignment of the BDD
        RetValue = Cudd_bddPickOneCube( dd, bImage, pValues );
        assert( RetValue );
        Cudd_RecursiveDeref( dd, bImage );

        // write PIs of counter-example
        Saig_ManForEachPi( p, pObj, i )
            if ( pValues[i] == 1 )
                Abc_InfoSetBit( pCex->pData, nPiOffset + i );
        nPiOffset -= Saig_ManPiNum(p);

        // check that we get the init state
        if ( v == 0 )
        {
            Saig_ManForEachLo( p, pObj, i )
                assert( pValues[Saig_ManPiNum(p)+i] == 0 );
            break;
        }

        // write state in terms of NS variables
        bState = (dd)->one; Cudd_Ref( bState );
        Saig_ManForEachLo( p, pObj, i )
        {
            bVar = Cudd_NotCond( dd->vars[Saig_ManCiNum(p)+i], pValues[Saig_ManPiNum(p)+i] != 1 );
            bState = Cudd_bddAnd( dd, bTemp = bState, bVar );  Cudd_Ref( bState );
            Cudd_RecursiveDeref( dd, bTemp ); 
        }
    }
    // cleanup
    Bbr_bddImageTreeDelete( pTree );
    ABC_FREE( pValues );
    // verify the counter example
    if ( Vec_PtrSize(vOnionRings) < 1000 )
    {
    RetValue = Saig_ManVerifyCex( p, pCex );
    if ( RetValue == 0 && !fSilent )
        printf( "Aig_ManVerifyUsingBdds(): Counter-example verification has FAILED.\n" );
    }
    if ( fVerbose && !fSilent )
    {
    ABC_PRT( "Counter-example generation time", Abc_Clock() - clk );
    }
    return pCex;
}